

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O1

long __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_hash
          (utf8_collator_from_wide *this,char *b,char *e)

{
  collate *pcVar1;
  long lVar2;
  wstring tmp;
  string local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"UTF-8","");
  conv::to_utf<wchar_t>(&local_40,b,e,&local_60,default_method);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pcVar1 = std::use_facet<std::__cxx11::collate<wchar_t>>(&this->base_);
  lVar2 = (**(code **)(*(long *)pcVar1 + 0x20))
                    (pcVar1,local_40._M_dataplus._M_p,
                     local_40._M_dataplus._M_p + local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return lVar2;
}

Assistant:

virtual long do_hash(char const *b,char const *e) const
    {
        std::wstring tmp=conv::to_utf<wchar_t>(b,e,"UTF-8");
        return std::use_facet<wfacet>(base_).hash(tmp.c_str(),tmp.c_str()+tmp.size());
    }